

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall
wabt::interp::Trap::Trap
          (Trap *this,Store *store,string *msg,
          vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *trace)

{
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *trace_local;
  string *msg_local;
  Store *store_local;
  Trap *this_local;
  
  Object::Object(&this->super_Object,Trap);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Trap_0049f878;
  std::__cxx11::string::string((string *)&this->message_,(string *)msg);
  std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector
            (&this->trace_,trace);
  return;
}

Assistant:

Trap::Trap(Store& store,
           const std::string& msg,
           const std::vector<Frame>& trace)
    : Object(skind), message_(msg), trace_(trace) {}